

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  char *pcVar1;
  ulong uVar2;
  ctrl_t *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  slot_type *ppDVar6;
  size_t sVar7;
  uint64_t uVar8;
  ulong uVar9;
  size_t sVar10;
  byte bVar11;
  size_t sVar12;
  byte bVar13;
  uint64_t v;
  ctrl_t cVar14;
  uchar *bytes_1;
  ulong uVar15;
  uchar *bytes;
  FindInfo FVar16;
  HashSetResizeHelper resize_helper;
  undefined1 local_62;
  undefined1 local_61;
  void *local_60;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  char local_3f;
  byte local_3e;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>]"
                 );
  }
  sVar10 = common->capacity_;
  if (sVar10 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>]"
                 );
  }
  bVar11 = 0x80;
  if (sVar10 == 1) {
    AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                *)0x1);
    if (1 < common->size_) {
      ppDVar6 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                          *)common);
      pcVar1 = (*ppDVar6)->filename;
      sVar7 = strlen(pcVar1);
      uVar8 = hash_internal::MixingHashState::CombineContiguousImpl
                        (&hash_internal::MixingHashState::kSeed,pcVar1,sVar7);
      bVar11 = (byte)((uVar8 ^ sVar7) * 0x5cb22ca68cb134ed >> 0x38) & 0x7f;
      bVar13 = 1;
      goto LAB_0029cd75;
    }
  }
  bVar13 = 0;
LAB_0029cd75:
  local_48 = common->capacity_;
  local_40 = (byte)common->size_ & 1;
  local_3f = sVar10 == 1;
  local_58.heap.control = (common->heap_or_soo_).heap.control;
  local_58.heap.slot_array =
       (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
  local_3e = bVar13;
  CommonFields::set_capacity(common,new_capacity);
  bVar5 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,8ul,true,true,8ul>
                    ((HashSetResizeHelper *)&local_58,common,&local_61,(int)(char)bVar11,8,8);
  if (local_48 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>]"
                 );
  }
  if ((bVar13 | sVar10 != 1) == 1) {
    local_60 = (common->heap_or_soo_).heap.slot_array.p;
    slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                *)common->capacity_);
    uVar4 = local_58.heap.slot_array;
    if (!bVar5) {
      if (sVar10 == 1) {
        pcVar1 = *(char **)(local_58.heap.control + 0x10);
        sVar7 = strlen(pcVar1);
        uVar8 = hash_internal::MixingHashState::CombineContiguousImpl
                          (&hash_internal::MixingHashState::kSeed,pcVar1,sVar7);
        uVar15 = (uVar8 ^ sVar7) * -0x234dd359734ecb13;
        FVar16 = find_first_non_full<void>
                           (common,uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
                                   (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8
                                   | (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 |
                                   (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38);
        uVar9 = FVar16.offset;
        uVar2 = common->capacity_;
        if (uVar2 <= uVar9) {
LAB_0029cfd5:
          __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x744,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar14 = (ctrl_t)(uVar15 >> 0x38) & ~kEmpty;
        pcVar3 = (common->heap_or_soo_).heap.control;
        pcVar3[uVar9] = cVar14;
        pcVar3[(ulong)((uint)uVar2 & 0xf) + (uVar9 - 0xf & uVar2)] = cVar14;
        common->capacity_ = 0xffffffffffffff9c;
        *(ctrl_t **)((long)local_60 + uVar9 * 8) = local_58.heap.control;
        CommonFields::set_capacity(common,uVar2);
      }
      else {
        if (local_3f == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_48 != 0) {
          sVar12 = 0;
          sVar10 = local_48;
          do {
            if (local_3f == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_58.heap.control[sVar12]) {
              pcVar1 = *(char **)(*(long *)(uVar4 + sVar12 * 8) + 0x10);
              sVar7 = strlen(pcVar1);
              uVar8 = hash_internal::MixingHashState::CombineContiguousImpl
                                (&hash_internal::MixingHashState::kSeed,pcVar1,sVar7);
              uVar15 = (uVar8 ^ sVar7) * -0x234dd359734ecb13;
              FVar16 = find_first_non_full<void>
                                 (common,uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
                                         (uVar15 & 0xff0000000000) >> 0x18 |
                                         (uVar15 & 0xff00000000) >> 8 | (uVar15 & 0xff000000) << 8 |
                                         (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
                                         uVar15 << 0x38);
              uVar9 = FVar16.offset;
              uVar2 = common->capacity_;
              if (uVar2 <= uVar9) goto LAB_0029cfd5;
              cVar14 = (ctrl_t)(uVar15 >> 0x38) & ~kEmpty;
              pcVar3 = (common->heap_or_soo_).heap.control;
              pcVar3[uVar9] = cVar14;
              pcVar3[(ulong)((uint)uVar2 & 0xf) + (uVar9 - 0xf & uVar2)] = cVar14;
              common->capacity_ = 0xffffffffffffff9c;
              *(undefined8 *)((long)local_60 + uVar9 * 8) = *(undefined8 *)(uVar4 + sVar12 * 8);
              CommonFields::set_capacity(common,uVar2);
              sVar10 = local_48;
            }
            sVar12 = sVar12 + 1;
          } while (sVar12 != sVar10);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_58,&local_62,8);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }